

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_ES_VERSION_2_0(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_ES_VERSION_2_0 != 0) {
    glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*in_RDI)("glActiveTexture");
    glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*in_RDI)("glAttachShader");
    glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*in_RDI)("glBindAttribLocation");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*in_RDI)("glBindBuffer");
    glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*in_RDI)("glBindFramebuffer");
    glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*in_RDI)("glBindRenderbuffer");
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*in_RDI)("glBindTexture");
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*in_RDI)("glBlendColor");
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*in_RDI)("glBlendEquation");
    glad_glBlendEquationSeparate =
         (PFNGLBLENDEQUATIONSEPARATEPROC)(*in_RDI)("glBlendEquationSeparate");
    glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*in_RDI)("glBlendFunc");
    glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*in_RDI)("glBlendFuncSeparate");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*in_RDI)("glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*in_RDI)("glBufferSubData");
    glad_glCheckFramebufferStatus =
         (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*in_RDI)("glCheckFramebufferStatus");
    glad_glClear = (PFNGLCLEARPROC)(*in_RDI)("glClear");
    glad_glClearColor = (PFNGLCLEARCOLORPROC)(*in_RDI)("glClearColor");
    glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*in_RDI)("glClearDepthf");
    glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*in_RDI)("glClearStencil");
    glad_glColorMask = (PFNGLCOLORMASKPROC)(*in_RDI)("glColorMask");
    glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*in_RDI)("glCompileShader");
    glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*in_RDI)("glCompressedTexImage2D")
    ;
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*in_RDI)("glCompressedTexSubImage2D");
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*in_RDI)("glCopyTexImage2D");
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*in_RDI)("glCopyTexSubImage2D");
    glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*in_RDI)("glCreateProgram");
    glad_glCreateShader = (PFNGLCREATESHADERPROC)(*in_RDI)("glCreateShader");
    glad_glCullFace = (PFNGLCULLFACEPROC)(*in_RDI)("glCullFace");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*in_RDI)("glDeleteBuffers");
    glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*in_RDI)("glDeleteFramebuffers");
    glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*in_RDI)("glDeleteProgram");
    glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*in_RDI)("glDeleteRenderbuffers");
    glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*in_RDI)("glDeleteShader");
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*in_RDI)("glDeleteTextures");
    glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*in_RDI)("glDepthFunc");
    glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*in_RDI)("glDepthMask");
    glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*in_RDI)("glDepthRangef");
    glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*in_RDI)("glDetachShader");
    glad_glDisable = (PFNGLDISABLEPROC)(*in_RDI)("glDisable");
    glad_glDisableVertexAttribArray =
         (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*in_RDI)("glDisableVertexAttribArray");
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*in_RDI)("glDrawArrays");
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*in_RDI)("glDrawElements");
    glad_glEnable = (PFNGLENABLEPROC)(*in_RDI)("glEnable");
    glad_glEnableVertexAttribArray =
         (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*in_RDI)("glEnableVertexAttribArray");
    glad_glFinish = (PFNGLFINISHPROC)(*in_RDI)("glFinish");
    glad_glFlush = (PFNGLFLUSHPROC)(*in_RDI)("glFlush");
    glad_glFramebufferRenderbuffer =
         (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*in_RDI)("glFramebufferRenderbuffer");
    glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*in_RDI)("glFramebufferTexture2D")
    ;
    glad_glFrontFace = (PFNGLFRONTFACEPROC)(*in_RDI)("glFrontFace");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*in_RDI)("glGenBuffers");
    glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*in_RDI)("glGenerateMipmap");
    glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*in_RDI)("glGenFramebuffers");
    glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*in_RDI)("glGenRenderbuffers");
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*in_RDI)("glGenTextures");
    glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*in_RDI)("glGetActiveAttrib");
    glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*in_RDI)("glGetActiveUniform");
    glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*in_RDI)("glGetAttachedShaders");
    glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*in_RDI)("glGetAttribLocation");
    glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*in_RDI)("glGetBooleanv");
    glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*in_RDI)("glGetBufferParameteriv")
    ;
    glad_glGetError = (PFNGLGETERRORPROC)(*in_RDI)("glGetError");
    glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*in_RDI)("glGetFloatv");
    glad_glGetFramebufferAttachmentParameteriv =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*in_RDI)("glGetFramebufferAttachmentParameteriv");
    glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*in_RDI)("glGetIntegerv");
    glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*in_RDI)("glGetProgramiv");
    glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*in_RDI)("glGetProgramInfoLog");
    glad_glGetRenderbufferParameteriv =
         (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*in_RDI)("glGetRenderbufferParameteriv");
    glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*in_RDI)("glGetShaderiv");
    glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*in_RDI)("glGetShaderInfoLog");
    glad_glGetShaderPrecisionFormat =
         (PFNGLGETSHADERPRECISIONFORMATPROC)(*in_RDI)("glGetShaderPrecisionFormat");
    glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*in_RDI)("glGetShaderSource");
    glad_glGetString = (PFNGLGETSTRINGPROC)(*in_RDI)("glGetString");
    glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*in_RDI)("glGetTexParameterfv");
    glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*in_RDI)("glGetTexParameteriv");
    glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*in_RDI)("glGetUniformfv");
    glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*in_RDI)("glGetUniformiv");
    glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*in_RDI)("glGetUniformLocation");
    glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*in_RDI)("glGetVertexAttribfv");
    glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*in_RDI)("glGetVertexAttribiv");
    glad_glGetVertexAttribPointerv =
         (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*in_RDI)("glGetVertexAttribPointerv");
    glad_glHint = (PFNGLHINTPROC)(*in_RDI)("glHint");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*in_RDI)("glIsBuffer");
    glad_glIsEnabled = (PFNGLISENABLEDPROC)(*in_RDI)("glIsEnabled");
    glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*in_RDI)("glIsFramebuffer");
    glad_glIsProgram = (PFNGLISPROGRAMPROC)(*in_RDI)("glIsProgram");
    glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*in_RDI)("glIsRenderbuffer");
    glad_glIsShader = (PFNGLISSHADERPROC)(*in_RDI)("glIsShader");
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*in_RDI)("glIsTexture");
    glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*in_RDI)("glLineWidth");
    glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*in_RDI)("glLinkProgram");
    glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*in_RDI)("glPixelStorei");
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*in_RDI)("glPolygonOffset");
    glad_glReadPixels = (PFNGLREADPIXELSPROC)(*in_RDI)("glReadPixels");
    glad_glReleaseShaderCompiler =
         (PFNGLRELEASESHADERCOMPILERPROC)(*in_RDI)("glReleaseShaderCompiler");
    glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*in_RDI)("glRenderbufferStorage");
    glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*in_RDI)("glSampleCoverage");
    glad_glScissor = (PFNGLSCISSORPROC)(*in_RDI)("glScissor");
    glad_glShaderBinary = (PFNGLSHADERBINARYPROC)(*in_RDI)("glShaderBinary");
    glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*in_RDI)("glShaderSource");
    glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*in_RDI)("glStencilFunc");
    glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*in_RDI)("glStencilFuncSeparate");
    glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*in_RDI)("glStencilMask");
    glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*in_RDI)("glStencilMaskSeparate");
    glad_glStencilOp = (PFNGLSTENCILOPPROC)(*in_RDI)("glStencilOp");
    glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*in_RDI)("glStencilOpSeparate");
    glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*in_RDI)("glTexImage2D");
    glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*in_RDI)("glTexParameterf");
    glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*in_RDI)("glTexParameterfv");
    glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*in_RDI)("glTexParameteri");
    glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*in_RDI)("glTexParameteriv");
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*in_RDI)("glTexSubImage2D");
    glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*in_RDI)("glUniform1f");
    glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*in_RDI)("glUniform1fv");
    glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*in_RDI)("glUniform1i");
    glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*in_RDI)("glUniform1iv");
    glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*in_RDI)("glUniform2f");
    glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*in_RDI)("glUniform2fv");
    glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*in_RDI)("glUniform2i");
    glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*in_RDI)("glUniform2iv");
    glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*in_RDI)("glUniform3f");
    glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*in_RDI)("glUniform3fv");
    glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*in_RDI)("glUniform3i");
    glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*in_RDI)("glUniform3iv");
    glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*in_RDI)("glUniform4f");
    glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*in_RDI)("glUniform4fv");
    glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*in_RDI)("glUniform4i");
    glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*in_RDI)("glUniform4iv");
    glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*in_RDI)("glUniformMatrix2fv");
    glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*in_RDI)("glUniformMatrix3fv");
    glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*in_RDI)("glUniformMatrix4fv");
    glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*in_RDI)("glUseProgram");
    glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*in_RDI)("glValidateProgram");
    glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*in_RDI)("glVertexAttrib1f");
    glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*in_RDI)("glVertexAttrib1fv");
    glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*in_RDI)("glVertexAttrib2f");
    glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*in_RDI)("glVertexAttrib2fv");
    glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*in_RDI)("glVertexAttrib3f");
    glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*in_RDI)("glVertexAttrib3fv");
    glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*in_RDI)("glVertexAttrib4f");
    glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*in_RDI)("glVertexAttrib4fv");
    glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*in_RDI)("glVertexAttribPointer");
    glad_glViewport = (PFNGLVIEWPORTPROC)(*in_RDI)("glViewport");
  }
  return;
}

Assistant:

static void load_GL_ES_VERSION_2_0(GLADloadproc load) {
	if(!GLAD_GL_ES_VERSION_2_0) return;
	glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)load("glActiveTexture");
	glad_glAttachShader = (PFNGLATTACHSHADERPROC)load("glAttachShader");
	glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)load("glBindAttribLocation");
	glad_glBindBuffer = (PFNGLBINDBUFFERPROC)load("glBindBuffer");
	glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)load("glBindFramebuffer");
	glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)load("glBindRenderbuffer");
	glad_glBindTexture = (PFNGLBINDTEXTUREPROC)load("glBindTexture");
	glad_glBlendColor = (PFNGLBLENDCOLORPROC)load("glBlendColor");
	glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)load("glBlendEquation");
	glad_glBlendEquationSeparate = (PFNGLBLENDEQUATIONSEPARATEPROC)load("glBlendEquationSeparate");
	glad_glBlendFunc = (PFNGLBLENDFUNCPROC)load("glBlendFunc");
	glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)load("glBlendFuncSeparate");
	glad_glBufferData = (PFNGLBUFFERDATAPROC)load("glBufferData");
	glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)load("glBufferSubData");
	glad_glCheckFramebufferStatus = (PFNGLCHECKFRAMEBUFFERSTATUSPROC)load("glCheckFramebufferStatus");
	glad_glClear = (PFNGLCLEARPROC)load("glClear");
	glad_glClearColor = (PFNGLCLEARCOLORPROC)load("glClearColor");
	glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)load("glClearDepthf");
	glad_glClearStencil = (PFNGLCLEARSTENCILPROC)load("glClearStencil");
	glad_glColorMask = (PFNGLCOLORMASKPROC)load("glColorMask");
	glad_glCompileShader = (PFNGLCOMPILESHADERPROC)load("glCompileShader");
	glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)load("glCompressedTexImage2D");
	glad_glCompressedTexSubImage2D = (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)load("glCompressedTexSubImage2D");
	glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)load("glCopyTexImage2D");
	glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)load("glCopyTexSubImage2D");
	glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)load("glCreateProgram");
	glad_glCreateShader = (PFNGLCREATESHADERPROC)load("glCreateShader");
	glad_glCullFace = (PFNGLCULLFACEPROC)load("glCullFace");
	glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)load("glDeleteBuffers");
	glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)load("glDeleteFramebuffers");
	glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)load("glDeleteProgram");
	glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)load("glDeleteRenderbuffers");
	glad_glDeleteShader = (PFNGLDELETESHADERPROC)load("glDeleteShader");
	glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)load("glDeleteTextures");
	glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)load("glDepthFunc");
	glad_glDepthMask = (PFNGLDEPTHMASKPROC)load("glDepthMask");
	glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)load("glDepthRangef");
	glad_glDetachShader = (PFNGLDETACHSHADERPROC)load("glDetachShader");
	glad_glDisable = (PFNGLDISABLEPROC)load("glDisable");
	glad_glDisableVertexAttribArray = (PFNGLDISABLEVERTEXATTRIBARRAYPROC)load("glDisableVertexAttribArray");
	glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)load("glDrawArrays");
	glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)load("glDrawElements");
	glad_glEnable = (PFNGLENABLEPROC)load("glEnable");
	glad_glEnableVertexAttribArray = (PFNGLENABLEVERTEXATTRIBARRAYPROC)load("glEnableVertexAttribArray");
	glad_glFinish = (PFNGLFINISHPROC)load("glFinish");
	glad_glFlush = (PFNGLFLUSHPROC)load("glFlush");
	glad_glFramebufferRenderbuffer = (PFNGLFRAMEBUFFERRENDERBUFFERPROC)load("glFramebufferRenderbuffer");
	glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)load("glFramebufferTexture2D");
	glad_glFrontFace = (PFNGLFRONTFACEPROC)load("glFrontFace");
	glad_glGenBuffers = (PFNGLGENBUFFERSPROC)load("glGenBuffers");
	glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)load("glGenerateMipmap");
	glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)load("glGenFramebuffers");
	glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)load("glGenRenderbuffers");
	glad_glGenTextures = (PFNGLGENTEXTURESPROC)load("glGenTextures");
	glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)load("glGetActiveAttrib");
	glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)load("glGetActiveUniform");
	glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)load("glGetAttachedShaders");
	glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)load("glGetAttribLocation");
	glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)load("glGetBooleanv");
	glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)load("glGetBufferParameteriv");
	glad_glGetError = (PFNGLGETERRORPROC)load("glGetError");
	glad_glGetFloatv = (PFNGLGETFLOATVPROC)load("glGetFloatv");
	glad_glGetFramebufferAttachmentParameteriv = (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)load("glGetFramebufferAttachmentParameteriv");
	glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)load("glGetIntegerv");
	glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)load("glGetProgramiv");
	glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)load("glGetProgramInfoLog");
	glad_glGetRenderbufferParameteriv = (PFNGLGETRENDERBUFFERPARAMETERIVPROC)load("glGetRenderbufferParameteriv");
	glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)load("glGetShaderiv");
	glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)load("glGetShaderInfoLog");
	glad_glGetShaderPrecisionFormat = (PFNGLGETSHADERPRECISIONFORMATPROC)load("glGetShaderPrecisionFormat");
	glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)load("glGetShaderSource");
	glad_glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)load("glGetTexParameterfv");
	glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)load("glGetTexParameteriv");
	glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)load("glGetUniformfv");
	glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)load("glGetUniformiv");
	glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)load("glGetUniformLocation");
	glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)load("glGetVertexAttribfv");
	glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)load("glGetVertexAttribiv");
	glad_glGetVertexAttribPointerv = (PFNGLGETVERTEXATTRIBPOINTERVPROC)load("glGetVertexAttribPointerv");
	glad_glHint = (PFNGLHINTPROC)load("glHint");
	glad_glIsBuffer = (PFNGLISBUFFERPROC)load("glIsBuffer");
	glad_glIsEnabled = (PFNGLISENABLEDPROC)load("glIsEnabled");
	glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)load("glIsFramebuffer");
	glad_glIsProgram = (PFNGLISPROGRAMPROC)load("glIsProgram");
	glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)load("glIsRenderbuffer");
	glad_glIsShader = (PFNGLISSHADERPROC)load("glIsShader");
	glad_glIsTexture = (PFNGLISTEXTUREPROC)load("glIsTexture");
	glad_glLineWidth = (PFNGLLINEWIDTHPROC)load("glLineWidth");
	glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)load("glLinkProgram");
	glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)load("glPixelStorei");
	glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)load("glPolygonOffset");
	glad_glReadPixels = (PFNGLREADPIXELSPROC)load("glReadPixels");
	glad_glReleaseShaderCompiler = (PFNGLRELEASESHADERCOMPILERPROC)load("glReleaseShaderCompiler");
	glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)load("glRenderbufferStorage");
	glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)load("glSampleCoverage");
	glad_glScissor = (PFNGLSCISSORPROC)load("glScissor");
	glad_glShaderBinary = (PFNGLSHADERBINARYPROC)load("glShaderBinary");
	glad_glShaderSource = (PFNGLSHADERSOURCEPROC)load("glShaderSource");
	glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)load("glStencilFunc");
	glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)load("glStencilFuncSeparate");
	glad_glStencilMask = (PFNGLSTENCILMASKPROC)load("glStencilMask");
	glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)load("glStencilMaskSeparate");
	glad_glStencilOp = (PFNGLSTENCILOPPROC)load("glStencilOp");
	glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)load("glStencilOpSeparate");
	glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)load("glTexImage2D");
	glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)load("glTexParameterf");
	glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)load("glTexParameterfv");
	glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)load("glTexParameteri");
	glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)load("glTexParameteriv");
	glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)load("glTexSubImage2D");
	glad_glUniform1f = (PFNGLUNIFORM1FPROC)load("glUniform1f");
	glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)load("glUniform1fv");
	glad_glUniform1i = (PFNGLUNIFORM1IPROC)load("glUniform1i");
	glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)load("glUniform1iv");
	glad_glUniform2f = (PFNGLUNIFORM2FPROC)load("glUniform2f");
	glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)load("glUniform2fv");
	glad_glUniform2i = (PFNGLUNIFORM2IPROC)load("glUniform2i");
	glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)load("glUniform2iv");
	glad_glUniform3f = (PFNGLUNIFORM3FPROC)load("glUniform3f");
	glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)load("glUniform3fv");
	glad_glUniform3i = (PFNGLUNIFORM3IPROC)load("glUniform3i");
	glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)load("glUniform3iv");
	glad_glUniform4f = (PFNGLUNIFORM4FPROC)load("glUniform4f");
	glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)load("glUniform4fv");
	glad_glUniform4i = (PFNGLUNIFORM4IPROC)load("glUniform4i");
	glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)load("glUniform4iv");
	glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)load("glUniformMatrix2fv");
	glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)load("glUniformMatrix3fv");
	glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)load("glUniformMatrix4fv");
	glad_glUseProgram = (PFNGLUSEPROGRAMPROC)load("glUseProgram");
	glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)load("glValidateProgram");
	glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)load("glVertexAttrib1f");
	glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)load("glVertexAttrib1fv");
	glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)load("glVertexAttrib2f");
	glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)load("glVertexAttrib2fv");
	glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)load("glVertexAttrib3f");
	glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)load("glVertexAttrib3fv");
	glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)load("glVertexAttrib4f");
	glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)load("glVertexAttrib4fv");
	glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)load("glVertexAttribPointer");
	glad_glViewport = (PFNGLVIEWPORTPROC)load("glViewport");
}